

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

Stack<rapidjson::CrtAllocator> * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::operator=
          (Stack<rapidjson::CrtAllocator> *this,Stack<rapidjson::CrtAllocator> *rhs)

{
  Stack<rapidjson::CrtAllocator> *in_RSI;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  
  if (in_RSI != in_RDI) {
    Destroy(in_RSI);
    in_RDI->allocator_ = in_RSI->allocator_;
    in_RDI->ownAllocator_ = in_RSI->ownAllocator_;
    in_RDI->stack_ = in_RSI->stack_;
    in_RDI->stackTop_ = in_RSI->stackTop_;
    in_RDI->stackEnd_ = in_RSI->stackEnd_;
    in_RDI->initialCapacity_ = in_RSI->initialCapacity_;
    in_RSI->allocator_ = (CrtAllocator *)0x0;
    in_RSI->ownAllocator_ = (CrtAllocator *)0x0;
    in_RSI->stack_ = (char *)0x0;
    in_RSI->stackTop_ = (char *)0x0;
    in_RSI->stackEnd_ = (char *)0x0;
    in_RSI->initialCapacity_ = 0;
  }
  return in_RDI;
}

Assistant:

Stack& operator=(Stack&& rhs) {
        if (&rhs != this)
        {
            Destroy();

            allocator_ = rhs.allocator_;
            ownAllocator_ = rhs.ownAllocator_;
            stack_ = rhs.stack_;
            stackTop_ = rhs.stackTop_;
            stackEnd_ = rhs.stackEnd_;
            initialCapacity_ = rhs.initialCapacity_;

            rhs.allocator_ = 0;
            rhs.ownAllocator_ = 0;
            rhs.stack_ = 0;
            rhs.stackTop_ = 0;
            rhs.stackEnd_ = 0;
            rhs.initialCapacity_ = 0;
        }
        return *this;
    }